

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

void Zyx_ManSetupVars(Zyx_Man_t *p)

{
  int iVar1;
  int Value;
  word *local_30;
  word *pSpec;
  int local_18;
  int m;
  int k;
  int i;
  Zyx_Man_t *p_local;
  
  if (p->pPars->fMajority == 0) {
    local_30 = p->pTruth;
  }
  else {
    local_30 = Zyx_ManTruth(p,p->nObjs);
  }
  for (m = p->pPars->nVars; m < p->nObjs; m = m + 1) {
    iVar1 = Zyx_FuncVar(p,m,0);
    Zyx_SetConstVar(p,iVar1,0);
  }
  for (m = p->pPars->nVars; m < p->nObjs; m = m + 1) {
    for (local_18 = m; local_18 < p->nObjs; local_18 = local_18 + 1) {
      iVar1 = Zyx_TopoVar(p,m,local_18);
      Zyx_SetConstVar(p,iVar1,0);
    }
  }
  iVar1 = Zyx_TopoVar(p,p->nObjs + -1,p->nObjs + -2);
  Zyx_SetConstVar(p,iVar1,1);
  if (p->pPars->fMajority != 0) {
    for (local_18 = 0; local_18 < p->pPars->nVars; local_18 = local_18 + 1) {
      iVar1 = Zyx_TopoVar(p,p->pPars->nVars,local_18);
      Zyx_SetConstVar(p,iVar1,(uint)(local_18 < 3));
    }
  }
  for (pSpec._4_4_ = 0; pSpec._4_4_ < 1 << ((byte)p->pPars->nVars & 0x1f);
      pSpec._4_4_ = pSpec._4_4_ + 1) {
    for (m = 0; m < p->pPars->nVars; m = m + 1) {
      iVar1 = Zyx_MintVar(p,pSpec._4_4_,m);
      Zyx_SetConstVar(p,iVar1,pSpec._4_4_ >> ((byte)m & 0x1f) & 1);
    }
    iVar1 = Zyx_MintVar(p,pSpec._4_4_,p->nObjs + -1);
    Value = Abc_TtGetBit(local_30,pSpec._4_4_);
    Zyx_SetConstVar(p,iVar1,Value);
  }
  return;
}

Assistant:

void Zyx_ManSetupVars( Zyx_Man_t * p )
{
    int i, k, m;
    word * pSpec = p->pPars->fMajority ? Zyx_ManTruth(p, p->nObjs) : p->pTruth;
    // set unused functionality vars to 0
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        Zyx_SetConstVar( p, Zyx_FuncVar(p, i, 0), 0 );
    // set unused topology vars
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( k = i; k < p->nObjs; k++ )
            Zyx_SetConstVar( p, Zyx_TopoVar(p, i, k), 0 );
    // connect topmost node
    Zyx_SetConstVar( p, Zyx_TopoVar(p, p->nObjs-1, p->nObjs-2), 1 );
    // connect first node
    if ( p->pPars->fMajority )
        for ( k = 0; k < p->pPars->nVars; k++ )
            Zyx_SetConstVar( p, Zyx_TopoVar(p, p->pPars->nVars, k), k < 3 );
    // set minterm vars
    for ( m = 0; m < (1 << p->pPars->nVars); m++ )
    {
        for ( i = 0; i < p->pPars->nVars; i++ )
            Zyx_SetConstVar( p, Zyx_MintVar(p, m, i), (m >> i) & 1 );
        Zyx_SetConstVar( p, Zyx_MintVar(p, m, p->nObjs-1), Abc_TtGetBit(pSpec, m) );
    }
}